

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdisplay.c
# Opt level: O0

void xdpy_destroy_display_hook_default(ALLEGRO_DISPLAY *d,_Bool is_last)

{
  byte bVar1;
  _Bool _Var2;
  ALLEGRO_SYSTEM *pAVar3;
  byte in_SIL;
  ALLEGRO_DISPLAY_XGLX *in_RDI;
  ALLEGRO_SYSTEM_XGLX *unaff_retaddr;
  ALLEGRO_DISPLAY_XGLX *glx;
  ALLEGRO_SYSTEM_XGLX *s;
  undefined7 in_stack_00000018;
  char *in_stack_00000028;
  int in_stack_00000034;
  char *in_stack_00000038;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int line;
  undefined7 in_stack_fffffffffffffff0;
  ALLEGRO_DISPLAY_XGLX *d_00;
  
  bVar1 = in_SIL & 1;
  pAVar3 = al_get_system_driver();
  d_00 = in_RDI;
  if (in_RDI->context != (GLXContext)0x0) {
    glXDestroyContext(pAVar3[1].displays._itemsize,in_RDI->context);
    in_RDI->context = (GLXContext)0x0;
    _Var2 = _al_trace_prefix(in_stack_00000038,in_stack_00000034,in_stack_00000028,d._4_4_,
                             (char *)CONCAT17(is_last,in_stack_00000018));
    if (_Var2) {
      _al_trace_suffix("destroy context.\n");
    }
  }
  line = (int)((ulong)pAVar3 >> 0x20);
  if (in_RDI->fbc == (GLXFBConfig *)0x0) {
    if (in_RDI->xvinfo != (XVisualInfo *)0x0) {
      al_free_with_context
                ((void *)CONCAT17(bVar1,in_stack_fffffffffffffff0),line,(char *)in_RDI,
                 (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      in_RDI->xvinfo = (XVisualInfo *)0x0;
    }
  }
  else {
    al_free_with_context
              ((void *)CONCAT17(bVar1,in_stack_fffffffffffffff0),line,(char *)in_RDI,
               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    in_RDI->fbc = (GLXFBConfig *)0x0;
    XFree(in_RDI->xvinfo);
    in_RDI->xvinfo = (XVisualInfo *)0x0;
  }
  if ((in_RDI->glxwindow != 0) && (in_RDI->glxwindow != in_RDI->window)) {
    glXDestroyWindow(pAVar3[1].vt,in_RDI->glxwindow);
    in_RDI->glxwindow = 0;
    _Var2 = _al_trace_prefix(in_stack_00000038,in_stack_00000034,in_stack_00000028,d._4_4_,
                             (char *)CONCAT17(is_last,in_stack_00000018));
    if (_Var2) {
      _al_trace_suffix("destroy glx window\n");
    }
  }
  _al_cond_destroy((_AL_COND *)0x203efc);
  _al_cond_destroy((_AL_COND *)0x203f0d);
  _Var2 = _al_trace_prefix(in_stack_00000038,in_stack_00000034,in_stack_00000028,d._4_4_,
                           (char *)CONCAT17(is_last,in_stack_00000018));
  if (_Var2) {
    _al_trace_suffix("destroy window.\n");
  }
  XDestroyWindow(pAVar3[1].vt,in_RDI->window);
  _al_xglx_unuse_adapter((ALLEGRO_SYSTEM_XGLX *)in_RDI,in_stack_ffffffffffffffdc);
  if (((d_00->display).flags & 2U) != 0) {
    restore_mode_if_last_fullscreen_display(unaff_retaddr,d_00);
  }
  return;
}

Assistant:

static void xdpy_destroy_display_hook_default(ALLEGRO_DISPLAY *d, bool is_last)
{
   ALLEGRO_SYSTEM_XGLX *s = (ALLEGRO_SYSTEM_XGLX *)al_get_system_driver();
   ALLEGRO_DISPLAY_XGLX *glx = (ALLEGRO_DISPLAY_XGLX *)d;
   (void)is_last;

   if (glx->context) {
      glXDestroyContext(s->gfxdisplay, glx->context);
      glx->context = NULL;
      ALLEGRO_DEBUG("destroy context.\n");
   }

   if (glx->fbc) {
      al_free(glx->fbc);
      glx->fbc = NULL;
      XFree(glx->xvinfo);
      glx->xvinfo = NULL;
   }
   else if (glx->xvinfo) {
      al_free(glx->xvinfo);
      glx->xvinfo = NULL;
   }

   if ((glx->glxwindow) && (glx->glxwindow != glx->window)) {
      glXDestroyWindow(s->x11display, glx->glxwindow);
      glx->glxwindow = 0;
      ALLEGRO_DEBUG("destroy glx window\n");
   }

   _al_cond_destroy(&glx->mapped);
   _al_cond_destroy(&glx->selectioned);

   ALLEGRO_DEBUG("destroy window.\n");
   XDestroyWindow(s->x11display, glx->window);

   _al_xglx_unuse_adapter(s, glx->adapter);

   if (d->flags & ALLEGRO_FULLSCREEN) {
      restore_mode_if_last_fullscreen_display(s, glx);
   }
}